

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O3

char * cJSONUtils_FindPointerFromObjectTo(cJSON *object,cJSON *target)

{
  char cVar1;
  int iVar2;
  char *__s;
  uchar *puVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  size_t length;
  char *pcVar7;
  long lVar8;
  cJSON *object_00;
  
  if (target != (cJSON *)0x0 && object != (cJSON *)0x0) {
    if (object == target) {
      puVar3 = cJSONUtils_strdup("");
      return (char *)puVar3;
    }
    object_00 = object->child;
    if (object_00 != (cJSON *)0x0) {
      lVar8 = 0;
      do {
        __s = cJSONUtils_FindPointerFromObjectTo(object_00,target);
        if (__s != (char *)0x0) {
          iVar2 = cJSON_IsArray(object);
          if (iVar2 != 0) {
            sVar4 = strlen(__s);
            pcVar5 = (char *)cJSON_malloc(sVar4 + 0x16);
            sprintf(pcVar5,"/%lu%s",lVar8,__s);
            goto LAB_0010141d;
          }
          iVar2 = cJSON_IsObject(object);
          if (iVar2 == 0) {
            cJSON_free(__s);
            return (char *)0x0;
          }
          sVar4 = strlen(__s);
          pcVar5 = object_00->string;
          lVar8 = 0;
          goto LAB_001013ab;
        }
        lVar8 = lVar8 + 1;
        object_00 = object_00->next;
      } while (object_00 != (cJSON *)0x0);
    }
  }
  return (char *)0x0;
LAB_001013ab:
  cVar1 = *pcVar5;
  if ((cVar1 == '/') || (cVar1 == '~')) {
    lVar8 = lVar8 + 1;
  }
  else if (cVar1 == '\0') goto LAB_001013c9;
  pcVar5 = pcVar5 + 1;
  lVar8 = lVar8 + 1;
  goto LAB_001013ab;
LAB_001013c9:
  pcVar5 = (char *)cJSON_malloc(sVar4 + lVar8 + 2);
  *pcVar5 = '/';
  pcVar7 = object_00->string;
  pcVar6 = pcVar5;
  do {
    cVar1 = *pcVar7;
    if (cVar1 == '/') {
      pcVar6[1] = '~';
      pcVar6[2] = '1';
LAB_00101406:
      pcVar6 = pcVar6 + 2;
    }
    else {
      if (cVar1 == '~') {
        pcVar6[1] = '~';
        pcVar6[2] = '0';
        goto LAB_00101406;
      }
      pcVar6 = pcVar6 + 1;
      if (cVar1 == '\0') {
        *pcVar6 = '\0';
        strcat(pcVar5,__s);
LAB_0010141d:
        cJSON_free(__s);
        return pcVar5;
      }
      *pcVar6 = cVar1;
    }
    pcVar7 = pcVar7 + 1;
  } while( true );
}

Assistant:

CJSON_PUBLIC(char *) cJSONUtils_FindPointerFromObjectTo(const cJSON * const object, const cJSON * const target)
{
    size_t child_index = 0;
    cJSON *current_child = 0;

    if ((object == NULL) || (target == NULL))
    {
        return NULL;
    }

    if (object == target)
    {
        /* found */
        return (char*)cJSONUtils_strdup((const unsigned char*)"");
    }

    /* recursively search all children of the object or array */
    for (current_child = object->child; current_child != NULL; (void)(current_child = current_child->next), child_index++)
    {
        unsigned char *target_pointer = (unsigned char*)cJSONUtils_FindPointerFromObjectTo(current_child, target);
        /* found the target? */
        if (target_pointer != NULL)
        {
            if (cJSON_IsArray(object))
            {
                /* reserve enough memory for a 64 bit integer + '/' and '\0' */
                unsigned char *full_pointer = (unsigned char*)cJSON_malloc(strlen((char*)target_pointer) + 20 + sizeof("/"));
                /* check if conversion to unsigned long is valid
                 * This should be eliminated at compile time by dead code elimination
                 * if size_t is an alias of unsigned long, or if it is bigger */
                if (child_index > ULONG_MAX)
                {
                    cJSON_free(target_pointer);
                    cJSON_free(full_pointer);
                    return NULL;
                }
                sprintf((char*)full_pointer, "/%lu%s", (unsigned long)child_index, target_pointer); /* /<array_index><path> */
                cJSON_free(target_pointer);

                return (char*)full_pointer;
            }

            if (cJSON_IsObject(object))
            {
                unsigned char *full_pointer = (unsigned char*)cJSON_malloc(strlen((char*)target_pointer) + pointer_encoded_length((unsigned char*)current_child->string) + 2);
                full_pointer[0] = '/';
                encode_string_as_pointer(full_pointer + 1, (unsigned char*)current_child->string);
                strcat((char*)full_pointer, (char*)target_pointer);
                cJSON_free(target_pointer);

                return (char*)full_pointer;
            }

            /* reached leaf of the tree, found nothing */
            cJSON_free(target_pointer);
            return NULL;
        }
    }

    /* not found */
    return NULL;
}